

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::io::anon_unknown_0::DefaultReadCordTest_ReadLargeCord_Test::
~DefaultReadCordTest_ReadLargeCord_Test(DefaultReadCordTest_ReadLargeCord_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(DefaultReadCordTest, ReadLargeCord) {
  std::string source = "abcdefghijk";
  for (int i = 0; i < 1024; i++) {
    source.append("abcdefghijk");
  }

  absl::Cord dest;
  ArrayInputStream input(source.data(), source.size());
  EXPECT_TRUE(input.Skip(1));
  EXPECT_TRUE(input.ReadCord(&dest, source.size() - 2));

  absl::Cord expected(source);
  expected.RemovePrefix(1);
  expected.RemoveSuffix(1);

  EXPECT_EQ(expected, dest);
}